

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

ctmbstr prvTidyGetNextDeclaredTag(TidyDocImpl *doc,UserTagType tagType,TidyIterator *iter)

{
  TidyIterator local_30;
  Dict *curr;
  ctmbstr name;
  TidyIterator *iter_local;
  UserTagType tagType_local;
  TidyDocImpl *doc_local;
  
  curr = (Dict *)0x0;
  for (local_30 = *iter; curr == (Dict *)0x0 && local_30 != (TidyIterator)0x0;
      local_30 = *(TidyIterator *)(local_30 + 0xe)) {
    switch(tagType) {
    case tagtype_null:
      break;
    case tagtype_empty:
      if ((local_30[8]._opaque & 1U) != 0) {
        curr = *(Dict **)(local_30 + 2);
      }
      break;
    case tagtype_inline:
      if ((local_30[8]._opaque & 0x10U) != 0) {
        curr = *(Dict **)(local_30 + 2);
      }
      break;
    case tagtype_block:
      if (((local_30[8]._opaque & 8U) != 0) && (*(code **)(local_30 + 10) == prvTidyParseBlock)) {
        curr = *(Dict **)(local_30 + 2);
      }
      break;
    case tagtype_pre:
      if (((local_30[8]._opaque & 8U) != 0) && (*(code **)(local_30 + 10) == prvTidyParsePre)) {
        curr = *(Dict **)(local_30 + 2);
      }
    }
  }
  *iter = local_30;
  return (ctmbstr)curr;
}

Assistant:

ctmbstr        TY_(GetNextDeclaredTag)( TidyDocImpl* ARG_UNUSED(doc),
                                        UserTagType tagType, TidyIterator* iter )
{
    ctmbstr name = NULL;
    Dict* curr;
    for ( curr = (Dict*) *iter; name == NULL && curr != NULL; curr = curr->next )
    {
        switch ( tagType )
        {
        case tagtype_empty:
            if ( (curr->model & CM_EMPTY) != 0 )
                name = curr->name;
            break;

        case tagtype_inline:
            if ( (curr->model & CM_INLINE) != 0 )
                name = curr->name;
            break;

        case tagtype_block:
            if ( (curr->model & CM_BLOCK) != 0 &&
                 curr->parser == TY_(ParseBlock) )
                name = curr->name;
            break;

        case tagtype_pre:
            if ( (curr->model & CM_BLOCK) != 0 &&
                 curr->parser == TY_(ParsePre) )
                name = curr->name;
            break;

        case tagtype_null:
            break;
        }
    }
    *iter = (TidyIterator) curr;
    return name;
}